

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O2

void __thiscall amrex::BaseFab<int>::define(BaseFab<int> *this)

{
  int iVar1;
  Long LVar2;
  int *piVar3;
  long lVar4;
  
  iVar1 = this->nvar;
  if ((long)iVar1 != 0) {
    LVar2 = Box::numPts(&this->domain);
    lVar4 = iVar1 * LVar2;
    this->truesize = lVar4;
    this->ptr_owner = true;
    piVar3 = (int *)DataAllocator::alloc(&this->super_DataAllocator,lVar4 * 4);
    this->dptr = piVar3;
    LVar2 = Box::numPts(&this->domain);
    update_fab_stats(LVar2,this->truesize,4);
    return;
  }
  return;
}

Assistant:

void
BaseFab<T>::define ()
{
    AMREX_ASSERT(this->dptr == 0);
    AMREX_ASSERT(this->domain.numPts() > 0);
    AMREX_ASSERT(this->nvar >= 0);
    if (this->nvar == 0) return;
    AMREX_ASSERT(std::numeric_limits<Long>::max()/this->nvar > this->domain.numPts());

    this->truesize  = this->nvar*this->domain.numPts();
    this->ptr_owner = true;
    this->dptr = static_cast<T*>(this->alloc(this->truesize*sizeof(T)));

    placementNew(this->dptr, this->truesize);

    amrex::update_fab_stats(this->domain.numPts(), this->truesize, sizeof(T));
}